

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O2

String * __thiscall Bstrlib::String::operator+=(String *this,double c)

{
  String local_20;
  
  Print((char *)&local_20,"%lg");
  operator+=(this,&local_20);
  ~String(&local_20);
  return this;
}

Assistant:

const String& String::operator +=(const double c)
    {
#ifndef HasFloatParsing
        char buffer[15] = { 0 };
        ftoa((float)c, buffer, 6);
        return *this += buffer;
#else
        return *this += String::Print("%lg", c);
#endif
    }